

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [12];
  ImGuiContext *pIVar6;
  ImGuiAxis IVar7;
  bool bVar8;
  ImU32 col;
  ImGuiCol idx;
  undefined1 uVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool held;
  bool hovered;
  float local_88;
  float local_84;
  float local_80;
  ImGuiAxis local_7c;
  float *local_78;
  float *local_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImRect local_58;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  uVar1 = (pIVar2->DC).ItemFlags;
  (pIVar2->DC).ItemFlags = uVar1 | 0x18;
  local_88 = hover_visibility_delay;
  local_84 = min_size1;
  local_80 = min_size2;
  local_7c = axis;
  local_78 = size1;
  local_70 = size2;
  local_48 = hover_extend;
  uStack_44 = in_XMM2_Db;
  uStack_40 = in_XMM2_Dc;
  uStack_3c = in_XMM2_Dd;
  bVar8 = ItemAdd(bb,id,(ImRect *)0x0);
  IVar7 = local_7c;
  (pIVar2->DC).ItemFlags = uVar1;
  uVar9 = 0;
  if (bVar8) {
    bVar8 = local_7c == ImGuiAxis_Y;
    auVar11[1] = bVar8;
    auVar11[0] = bVar8;
    auVar11[2] = bVar8;
    auVar11[3] = bVar8;
    auVar11[4] = bVar8;
    auVar11[5] = bVar8;
    auVar11[6] = bVar8;
    auVar11[7] = bVar8;
    auVar11[8] = bVar8;
    auVar11[9] = bVar8;
    auVar11[10] = bVar8;
    auVar11[0xb] = bVar8;
    auVar11[0xc] = bVar8;
    auVar11[0xd] = bVar8;
    auVar11[0xe] = bVar8;
    auVar11[0xf] = bVar8;
    auVar11 = vpslld_avx(auVar11,0x1f);
    auVar3._4_4_ = uStack_44;
    auVar3._0_4_ = local_48;
    auVar3._8_4_ = uStack_40;
    auVar3._12_4_ = uStack_3c;
    auVar3 = vinsertps_avx(auVar11,auVar3,0x1d);
    auVar14._4_8_ = SUB128(ZEXT812(0),4);
    auVar14._0_4_ = local_48;
    auVar14._12_4_ = 0;
    auVar3 = vblendvps_avx(auVar14,auVar3,auVar11);
    auVar11 = vsubps_avx((undefined1  [16])*bb,auVar3);
    auVar5._4_8_ = auVar3._0_8_;
    auVar5._0_4_ = (bb->Min).y + auVar3._4_4_;
    auVar12._0_8_ = auVar5._0_8_ << 0x20;
    auVar12._8_4_ = (bb->Max).x + auVar3._0_4_;
    auVar12._12_4_ = (bb->Max).y + auVar3._4_4_;
    local_58.Max = auVar12._8_8_;
    local_58.Min.x = auVar11._0_4_;
    local_58.Min.y = auVar11._4_4_;
    ButtonBehavior(&local_58,id,&hovered,&held,0x1800);
    if (pIVar6->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if ((held != false) ||
       (((pIVar6->HoveredId == id && (pIVar6->HoveredIdPreviousFrame == id)) &&
        (local_88 <= pIVar6->HoveredIdTimer)))) {
      SetMouseCursor((IVar7 != ImGuiAxis_Y) + 3);
    }
    local_68 = bb->Min;
    IStack_60 = bb->Max;
    if ((held & 1U) != 0) {
      if (IVar7 == ImGuiAxis_Y) {
        fVar10 = ((pIVar6->IO).MousePos.y - (pIVar6->ActiveIdClickOffset).y) - local_58.Min.y;
      }
      else {
        fVar10 = ((pIVar6->IO).MousePos.x - (pIVar6->ActiveIdClickOffset).x) - local_58.Min.x;
      }
      fVar4 = *local_78 - local_84;
      auVar11 = ZEXT416((uint)(*local_70 - local_80));
      auVar3 = vcmpss_avx(auVar11,ZEXT816(0) << 0x40,2);
      auVar3 = vandnps_avx(auVar3,auVar11);
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar16._0_4_ = -fVar4;
      auVar16._4_4_ = 0x80000000;
      auVar16._8_4_ = 0x80000000;
      auVar16._12_4_ = 0x80000000;
      auVar11 = vcmpss_avx(ZEXT416((uint)fVar4),auVar16,2);
      auVar11 = vblendvps_avx(auVar16,auVar15,auVar11);
      auVar11 = vmaxss_avx(auVar11,ZEXT416((uint)fVar10));
      auVar3 = vminss_avx(auVar3,auVar11);
      fVar10 = auVar3._0_4_;
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        fVar4 = *local_78 + fVar10;
        if ((fVar10 < 0.0) && (fVar4 < local_84)) {
          __assert_fail("*size1 + mouse_delta >= min_size1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                        ,0x5ba,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        if ((0.0 < fVar10) && (*local_70 - fVar10 < local_80)) {
          __assert_fail("*size2 - mouse_delta >= min_size2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                        ,0x5bc,
                        "bool ImGui::SplitterBehavior(const ImRect &, ImGuiID, ImGuiAxis, float *, float *, float, float, float, float)"
                       );
        }
        *local_78 = fVar4;
        *local_70 = *local_70 - fVar10;
        bVar8 = IVar7 == ImGuiAxis_X;
        auVar13[1] = bVar8;
        auVar13[0] = bVar8;
        auVar13[2] = bVar8;
        auVar13[3] = bVar8;
        auVar13[4] = bVar8;
        auVar13[5] = bVar8;
        auVar13[6] = bVar8;
        auVar13[7] = bVar8;
        auVar13[8] = bVar8;
        auVar13[9] = bVar8;
        auVar13[10] = bVar8;
        auVar13[0xb] = bVar8;
        auVar13[0xc] = bVar8;
        auVar13[0xd] = bVar8;
        auVar13[0xe] = bVar8;
        auVar13[0xf] = bVar8;
        auVar11 = vpslld_avx(auVar13,0x1f);
        auVar3 = vunpcklps_avx(ZEXT816(0),auVar3);
        auVar3 = vblendvps_avx(auVar3,ZEXT416((uint)fVar10),auVar11);
        local_68.y = auVar3._4_4_ + local_68.y;
        local_68.x = auVar3._0_4_ + local_68.x;
        IStack_60.y = auVar3._4_4_ + IStack_60.y;
        IStack_60.x = auVar3._0_4_ + IStack_60.x;
        MarkItemEdited(id);
      }
    }
    if ((held & 1U) == 0) {
      if (hovered == true) {
        idx = 0x1c - (uint)(pIVar6->HoveredIdTimer < local_88);
      }
      else {
        idx = 0x1b;
      }
    }
    else {
      idx = 0x1d;
    }
    col = GetColorU32(idx,1.0);
    ImDrawList::AddRectFilled(pIVar2->DrawList,&local_68,&IStack_60,col,0.0,0xf);
    uVar9 = held;
  }
  return (bool)uVar9;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}